

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O3

void __thiscall json_service::both(json_service *this,string *msg)

{
  char cVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *this_00;
  ostringstream oss;
  value avStack_1b8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198 [11];
  
  cVar1 = cppcms::rpc::json_rpc_server::notification();
  if (cVar1 == '\0') {
    std::operator+(local_198,"call:",msg);
    cppcms::json::value::value<std::__cxx11::string>(avStack_1b8,local_198);
    cppcms::rpc::json_rpc_server::return_result((value *)this);
    cppcms::json::value::copyable::~copyable(&avStack_1b8[0].d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198[0]._M_dataplus._M_p != &local_198[0].field_2) {
      operator_delete(local_198[0]._M_dataplus._M_p);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)msg);
    if (iVar2 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Error ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                 ,0x5f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_198,0x4e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," msg==\"notification\"",0x14);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,(string *)avStack_1b8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void both(std::string msg)
	{
		if(notification())
			TEST(msg=="notification");
		else
			return_result("call:"+msg);
	}